

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

double __thiscall TasGrid::RuleWavelet::getWeight(RuleWavelet *this,int point)

{
  double local_38;
  double local_30;
  int point_local;
  RuleWavelet *this_local;
  
  if (this->order == 1) {
    if (point == 0) {
      local_30 = 1.0;
    }
    else {
      local_38 = 0.5;
      if (2 < point) {
        local_38 = 0.0;
      }
      local_30 = local_38;
    }
    return local_30;
  }
  if (this->order == 3) {
    if (4 < point) {
      return 0.0;
    }
    if (point == 0) {
      return 0.3416666666666667;
    }
    if (point - 1U < 2) {
      return 0.16805555555555557;
    }
    if (point - 3U < 2) {
      return 0.6611111111111111;
    }
  }
  return 0.0;
}

Assistant:

double RuleWavelet::getWeight(int point) const{
    // Returns the integral of the given wavelet.
    if (order == 1){
        return (point == 0) ? 1.0 : (point <= 2) ? 0.5 : 0.0;
    }else if(order == 3){
        if (point > 4){
            return 0.0;
        }
        switch (point){
        case 1:
        case 2:
            return 1.680555555555555691e-01;
        case 3:
        case 4:
            return 6.611111111111110938e-01;
        case 0:
            return 3.416666666666666741e-01;
        }
    }
    return 0.0;
}